

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtsStreamReader.cpp
# Opt level: O3

int __thiscall
DTSStreamReader::getTSDescriptor
          (DTSStreamReader *this,uint8_t *dstBuff,bool blurayMode,bool hdmvDescriptors)

{
  uint8_t uVar1;
  uint uVar2;
  int iVar3;
  uint8_t *buff;
  int iStack_48;
  int local_44;
  BitStreamWriter local_40;
  
  buff = findFrame(this,(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_buffer,
                   (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd);
  if (buff == (uint8_t *)0x0) {
    iVar3 = 0;
  }
  else {
    uVar2 = decodeFrame(this,buff,
                        (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd,
                        &local_44,&iStack_48);
    iVar3 = 0;
    if ((0 < (int)uVar2) && (this->m_state = stDecodeDTS, !hdmvDescriptors)) {
      builtin_memcpy(dstBuff,"\x05\x04DTS",5);
      iVar3 = this->pi_frame_length;
      if (iVar3 == 0x200) {
        uVar1 = '1';
      }
      else if (iVar3 == 0x800) {
        uVar1 = '3';
      }
      else if (iVar3 == 0x400) {
        uVar1 = '2';
      }
      else {
        uVar1 = ' ';
      }
      dstBuff[5] = uVar1;
      dstBuff[6] = 's';
      dstBuff[7] = '\x05';
      local_40.super_BitStream.m_buffer = (uint *)(dstBuff + 8);
      local_40.super_BitStream.m_totalBits = 0x28;
      local_40.m_curVal = 0;
      local_40.m_bitWrited = 0;
      local_40.super_BitStream.m_initBuffer = local_40.super_BitStream.m_buffer;
      BitStreamWriter::putBits(&local_40,4,this->pi_sample_rate_index);
      BitStreamWriter::putBits(&local_40,6,this->pi_bit_rate_index);
      BitStreamWriter::putBits(&local_40,7,this->nblks);
      BitStreamWriter::putBits(&local_40,0xe,uVar2);
      uVar2 = getSurroundModeCode(this);
      BitStreamWriter::putBits(&local_40,6,uVar2);
      BitStreamWriter::putBits(&local_40,1,(uint)this->pi_channels_conf >> 0xc & 1);
      BitStreamWriter::putBits(&local_40,2,(uint)(this->m_dtsEsChannels != 0));
      BitStreamWriter::flushBits(&local_40);
      iVar3 = 0xd;
    }
  }
  return iVar3;
}

Assistant:

int DTSStreamReader::getTSDescriptor(uint8_t* dstBuff, bool blurayMode, const bool hdmvDescriptors)
{
    uint8_t* frame = findFrame(m_buffer, m_bufEnd);
    if (frame == nullptr)
        return 0;
    int skipBytes = 0;
    int skipBeforeBytes = 0;
    const int len = decodeFrame(frame, m_bufEnd, skipBytes, skipBeforeBytes);
    if (len < 1)
        return 0;

    m_state = DTSDecodeState::stDecodeDTS;

    // no DTS descriptor in Blu-ray
    if (hdmvDescriptors)
        return 0;

    // ETSI TS 101 154 F.4.2 DTS registration descriptor
    *dstBuff++ = static_cast<int>(TSDescriptorTag::REGISTRATION);  // descriptor tag
    *dstBuff++ = 4;                                                // descriptor length
    *dstBuff++ = 'D';
    *dstBuff++ = 'T';
    *dstBuff++ = 'S';

    switch (pi_frame_length)
    {
    case 512:
        *dstBuff++ = '1';
        break;
    case 1024:
        *dstBuff++ = '2';
        break;
    case 2048:
        *dstBuff++ = '3';
        break;
    default:
        *dstBuff++ = ' ';
    }

    // ETSI TS 101 154 F.4.3 DTS audio descriptor
    BitStreamWriter bitWriter{};

    *dstBuff++ = static_cast<uint8_t>(TSDescriptorTag::DTS);  // descriptor tag;
    *dstBuff++ = 5;                                           // descriptor length
    bitWriter.setBuffer(dstBuff, dstBuff + 5);
    bitWriter.putBits(4, pi_sample_rate_index);
    bitWriter.putBits(6, pi_bit_rate_index);
    bitWriter.putBits(7, nblks);
    bitWriter.putBits(14, len);
    bitWriter.putBits(6, getSurroundModeCode());
    bitWriter.putBits(1, (pi_channels_conf & AOUT_CHAN_LFE) ? 1 : 0);
    bitWriter.putBits(2, m_dtsEsChannels ? 1 : 0);  // DTS-EX flag
    bitWriter.flushBits();

    return 13;  // descriptor length
}